

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::Interpreter
          (Interpreter *this,Allocator *alloc,ExtMap *ext_vars,uint max_stack,double gc_min_objects,
          double gc_growth_trigger,VmNativeCallbackMap *native_callbacks,
          JsonnetImportCallback *import_callback,void *import_callback_context)

{
  ExtMap *this_00;
  BuiltinMap *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long uVar2;
  AST *pAVar3;
  Identifier *pIVar4;
  Var *pVVar5;
  mapped_type *pmVar6;
  DesugaredObject *ast;
  HeapEntity *pHVar7;
  long lVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  HeapObject *pHVar11;
  u32string *puVar12;
  mapped_type from;
  mapped_type *ppHVar13;
  _Rb_tree_header *p_Var14;
  pointer pFVar15;
  pointer pFVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  UString name;
  LocationRange local_f0;
  ExtMap *local_b0;
  Stack *local_a8;
  Allocator *local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  string local_88;
  vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
  *local_68;
  pointer local_60;
  SourceFuncMap *local_58;
  string local_50;
  
  (this->heap).gcTuneMinObjects = (uint)(long)gc_min_objects;
  (this->heap).gcTuneGrowthTrigger = gc_growth_trigger;
  (this->heap).lastMark = '\0';
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap).entities.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heap).lastNumEntities = 0;
  (this->heap).numEntities = 0;
  local_a8 = &this->stack;
  (this->stack)._vptr_Stack = (_func_int **)&PTR_dump_0023e488;
  (this->stack).calls = 0;
  (this->stack).limit = max_stack;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack).stack.
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->alloc = alloc;
  local_f0.file._M_dataplus._M_p = (pointer)&local_f0.file.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f0,L"import",L"");
  pIVar4 = Allocator::makeIdentifier(alloc,(UString *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != &local_f0.file.field_2) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idImport = pIVar4;
  local_f0.file._M_dataplus._M_p = (pointer)&local_f0.file.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>
            ((u32string *)&local_f0,L"array_element",L"");
  pIVar4 = Allocator::makeIdentifier(alloc,(UString *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != &local_f0.file.field_2) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idArrayElement = pIVar4;
  local_f0.file._M_dataplus._M_p = (pointer)&local_f0.file.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>
            ((u32string *)&local_f0,L"object_assert",L"");
  pIVar4 = Allocator::makeIdentifier(alloc,(UString *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != &local_f0.file.field_2) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idInvariant = pIVar4;
  local_f0.file._M_dataplus._M_p = (pointer)&local_f0.file.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f0,L"__internal__",L"")
  ;
  pIVar4 = Allocator::makeIdentifier(alloc,(UString *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != &local_f0.file.field_2) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idInternal = pIVar4;
  local_f0.file._M_dataplus._M_p = (pointer)&local_f0.file.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f0,L"_",L"");
  pIVar4 = Allocator::makeIdentifier(alloc,(UString *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != &local_f0.file.field_2) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idJsonObjVar = pIVar4;
  local_f0.file._M_dataplus._M_p = (pointer)&local_f0.file.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_f0,L"");
  local_a0 = alloc;
  pIVar4 = Allocator::makeIdentifier(alloc,(UString *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != &local_f0.file.field_2) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) * 4 + 4);
  }
  this->idEmpty = pIVar4;
  paVar1 = &local_f0.file.field_2;
  local_f0.file._M_string_length = 0;
  local_f0.file.field_2._M_local_buf[0] = '\0';
  local_f0.begin.line = 0;
  local_f0.begin.column = 0;
  local_f0.end.line = 0;
  local_f0.end.column = 0;
  local_88.field_2._M_allocated_capacity = 0;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  pVVar5 = Allocator::
           make<jsonnet::internal::Var,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,jsonnet::internal::Identifier_const*&>
                     (local_a0,&local_f0,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)&local_88,&this->idJsonObjVar);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  this->jsonObjVar = &pVVar5->super_AST;
  local_90 = &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_90;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_90;
  (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->externalVars;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  ::_Rb_tree(&this_00->_M_t,&ext_vars->_M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
  ::_Rb_tree(&(this->nativeCallbacks)._M_t,&native_callbacks->_M_t);
  this->importCallback = import_callback;
  this->importCallbackContext = import_callback_context;
  p_Var14 = &(this->builtins)._M_t._M_impl.super__Rb_tree_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var14->_M_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var14->_M_header;
  (this->builtins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_98;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_98;
  local_68 = (vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
              *)&this->sourceFuncIds;
  (this->scratch).t = NULL_TYPE;
  (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceFuncIds).
  super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_f0.file.field_2;
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"makeArray","");
  this_01 = &this->builtins;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinMakeArray;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"pow","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinPow;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"floor","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinFloor;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"ceil","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinCeil;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sqrt","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinSqrt;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"sin","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinSin;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"cos","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinCos;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"tan","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinTan;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"asin","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinAsin;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"acos","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinAcos;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"atan","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinAtan;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"type","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinType;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"filter","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinFilter;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"objectHasEx","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinObjectHasEx;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"length","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinLength;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"objectFieldsEx","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinObjectFieldsEx;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"codepoint","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinCodepoint;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"char","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinChar;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"log","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinLog;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"exp","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinExp;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"mantissa","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinMantissa;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"exponent","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinExponent;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"modulo","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinModulo;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"extVar","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinExtVar;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"primitiveEquals","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinPrimitiveEquals;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"native","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinNative;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"md5","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinMd5;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"trace","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinTrace;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"splitLimit","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinSplitLimit;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"substr","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinSubstr;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"range","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinRange;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"strReplace","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinStrReplace;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"asciiLower","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinAsciiLower;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"asciiUpper","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinAsciiUpper;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"join","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinJoin;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"parseJson","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinParseJson;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"parseYaml","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinParseYaml;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"encodeUTF8","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinEncodeUTF8;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"decodeUTF8","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinDecodeUTF8;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"atan2","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinAtan2;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_f0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"hypot","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
           ::operator[](this_01,&local_f0.file);
  *pmVar6 = (mapped_type)builtinHypot;
  pmVar6[1] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.file._M_dataplus._M_p,
                    CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                             local_f0.file.field_2._M_local_buf[0]) + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"__internal__","");
  ast = makeStdlibAST(local_a0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  jsonnet_static_analysis(&ast->super_AST);
  this->stdlibAST = ast;
  pHVar7 = (HeapEntity *)operator_new(0x70);
  local_a0 = (Allocator *)&(this->heap).entities;
  *(undefined2 *)&pHVar7->type = 0;
  pHVar7->_vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0023e4c8;
  pHVar7[2]._vptr_HeapEntity = (_func_int **)0x0;
  *(undefined4 *)&pHVar7[3]._vptr_HeapEntity = 0;
  pHVar7[3].mark = '\0';
  pHVar7[3].type = THUNK;
  *(undefined6 *)&pHVar7[3].field_0xa = 0;
  pHVar7[4]._vptr_HeapEntity = (_func_int **)(pHVar7 + 3);
  *(HeapEntity **)&pHVar7[4].mark = pHVar7 + 3;
  pHVar7[5]._vptr_HeapEntity = (_func_int **)0x0;
  pHVar7[5].mark = '\0';
  pHVar7[5].type = THUNK;
  *(undefined6 *)&pHVar7[5].field_0xa = 0;
  *(undefined4 *)&pHVar7[6]._vptr_HeapEntity = 0;
  *(DesugaredObject **)&pHVar7[6].mark = ast;
  local_f0.file._M_dataplus._M_p = (pointer)pHVar7;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)local_a0,(value_type *)&local_f0);
  pHVar7->mark = (this->heap).lastMark;
  lVar8 = (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = lVar8 >> 3;
  (this->heap).numEntities = uVar9;
  if (((this->heap).gcTuneMinObjects < uVar9) &&
     (auVar17._8_4_ = (int)(lVar8 >> 0x23), auVar17._0_8_ = uVar9, auVar17._12_4_ = 0x45300000,
     uVar2 = (this->heap).lastNumEntities, auVar18._8_4_ = (int)(uVar2 >> 0x20),
     auVar18._0_8_ = uVar2, auVar18._12_4_ = 0x45300000,
     ((auVar18._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
     (this->heap).gcTuneGrowthTrigger <
     (auVar17._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0))) {
    Heap::markFrom(&this->heap,pHVar7);
    Stack::mark(local_a8,&this->heap);
    if (((this->scratch).t & ARRAY) != NULL_TYPE) {
      Heap::markFrom(&this->heap,(this->scratch).v.h);
    }
    p_Var10 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var10 != local_90) {
      do {
        if (*(HeapEntity **)(*(long *)(p_Var10 + 3) + 0x40) != (HeapEntity *)0x0) {
          Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var10 + 3) + 0x40));
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != local_90);
    }
    p_Var10 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var10 != local_98) {
      do {
        Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var10 + 2));
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != local_98);
    }
    Heap::sweep(&this->heap);
  }
  Stack::newCall(local_a8,(LocationRange *)(*(long *)&pHVar7[6].mark + 8),pHVar7,
                 *(HeapObject **)&pHVar7[5].mark,*(uint *)&pHVar7[6]._vptr_HeapEntity,
                 (BindingFrame *)&pHVar7[2].mark);
  evaluate(this,*(AST **)&pHVar7[6].mark,0);
  pHVar7 = (this->scratch).v.h;
  local_b0 = this_00;
  if (pHVar7 == (HeapEntity *)0x0) {
    pHVar11 = (HeapObject *)0x0;
  }
  else {
    pHVar11 = (HeapObject *)
              __dynamic_cast(pHVar7,&(anonymous_namespace)::HeapEntity::typeinfo,
                             &(anonymous_namespace)::HeapObject::typeinfo,0);
  }
  this->stdObject = pHVar11;
  pFVar15 = (this->stdlibAST->fields).
            super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar16 = (this->stdlibAST->fields).
            super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar15 != pFVar16) {
    local_58 = &this->sourceVals;
    local_60 = pFVar16;
    do {
      if (pFVar15->name->type == AST_LITERAL_STRING) {
        lVar8 = __dynamic_cast(pFVar15->name,&AST::typeinfo,&LiteralString::typeinfo,0);
        local_f0.file._M_dataplus._M_p = (pointer)&local_f0.file.field_2;
        std::__cxx11::u32string::_M_construct<char32_t*>
                  ((u32string *)&local_f0,*(long *)(lVar8 + 0x80),
                   *(long *)(lVar8 + 0x80) + *(long *)(lVar8 + 0x88) * 4);
        puVar12 = (u32string *)operator_new(0x20);
        *(u32string **)puVar12 = puVar12 + 0x10;
        std::__cxx11::u32string::_M_construct<char32_t*>
                  (puVar12,local_f0.file._M_dataplus._M_p,
                   local_f0.file._M_dataplus._M_p + local_f0.file._M_string_length * 4);
        local_88._M_dataplus._M_p = (pointer)puVar12;
        std::
        vector<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>,std::allocator<std::unique_ptr<jsonnet::internal::Identifier,std::default_delete<jsonnet::internal::Identifier>>>>
        ::emplace_back<jsonnet::internal::Identifier*>(local_68,(Identifier **)&local_88);
        pIVar4 = (this->sourceFuncIds).
                 super__Vector_base<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_jsonnet::internal::Identifier_*,_std::default_delete<jsonnet::internal::Identifier>_>
                 .super__Head_base<0UL,_jsonnet::internal::Identifier_*,_false>._M_head_impl;
        from = (mapped_type)operator_new(0x70);
        pHVar11 = this->stdObject;
        pAVar3 = pFVar15->body;
        *(undefined2 *)&(from->super_HeapEntity).type = 0;
        (from->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapThunk_0023e4c8;
        from->name = pIVar4;
        p_Var14 = &(from->upValues)._M_t._M_impl.super__Rb_tree_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var14->_M_header;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var14->_M_header
        ;
        (from->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        from->self = pHVar11;
        from->offset = 0;
        from->body = pAVar3;
        local_88._M_dataplus._M_p = (pointer)from;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                     *)local_a0,(value_type *)&local_88);
        (from->super_HeapEntity).mark = (this->heap).lastMark;
        lVar8 = (long)(this->heap).entities.
                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->heap).entities.
                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = lVar8 >> 3;
        (this->heap).numEntities = uVar9;
        if (((this->heap).gcTuneMinObjects < uVar9) &&
           (auVar19._8_4_ = (int)(lVar8 >> 0x23), auVar19._0_8_ = uVar9, auVar19._12_4_ = 0x45300000
           , uVar2 = (this->heap).lastNumEntities, auVar20._8_4_ = (int)(uVar2 >> 0x20),
           auVar20._0_8_ = uVar2, auVar20._12_4_ = 0x45300000,
           ((auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
           (this->heap).gcTuneGrowthTrigger <
           (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0))) {
          Heap::markFrom(&this->heap,(HeapEntity *)from);
          Stack::mark(local_a8,&this->heap);
          if (((this->scratch).t & ARRAY) != NULL_TYPE) {
            Heap::markFrom(&this->heap,(this->scratch).v.h);
          }
          p_Var10 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var10 != local_90) {
            do {
              if (*(HeapEntity **)(*(long *)(p_Var10 + 3) + 0x40) != (HeapEntity *)0x0) {
                Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var10 + 3) + 0x40));
              }
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
            } while (p_Var10 != local_90);
          }
          p_Var10 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var10 != local_98) {
            do {
              Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var10 + 2));
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
            } while (p_Var10 != local_98);
          }
          Heap::sweep(&this->heap);
        }
        encode_utf8(&local_88,(UString *)&local_f0);
        ppHVar13 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                   ::operator[](local_58,&local_88);
        pFVar16 = local_60;
        *ppHVar13 = from;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.file._M_dataplus._M_p != &local_f0.file.field_2) {
          operator_delete(local_f0.file._M_dataplus._M_p,
                          CONCAT71(local_f0.file.field_2._M_allocated_capacity._1_7_,
                                   local_f0.file.field_2._M_local_buf[0]) * 4 + 4);
        }
      }
      pFVar15 = pFVar15 + 1;
    } while (pFVar15 != pFVar16);
  }
  return;
}

Assistant:

Interpreter(Allocator *alloc, const ExtMap &ext_vars, unsigned max_stack, double gc_min_objects,
                double gc_growth_trigger, const VmNativeCallbackMap &native_callbacks,
                JsonnetImportCallback *import_callback, void *import_callback_context)

        : heap(gc_min_objects, gc_growth_trigger),
          stack(max_stack),
          alloc(alloc),
          idImport(alloc->makeIdentifier(U"import")),
          idArrayElement(alloc->makeIdentifier(U"array_element")),
          idInvariant(alloc->makeIdentifier(U"object_assert")),
          idInternal(alloc->makeIdentifier(U"__internal__")),
          idJsonObjVar(alloc->makeIdentifier(U"_")),
          idEmpty(alloc->makeIdentifier(U"")),
          jsonObjVar(alloc->make<Var>(LocationRange(), Fodder{}, idJsonObjVar)),
          externalVars(ext_vars),
          nativeCallbacks(native_callbacks),
          importCallback(import_callback),
          importCallbackContext(import_callback_context)
    {
        scratch = makeNull();
        builtins["makeArray"] = &Interpreter::builtinMakeArray;
        builtins["pow"] = &Interpreter::builtinPow;
        builtins["floor"] = &Interpreter::builtinFloor;
        builtins["ceil"] = &Interpreter::builtinCeil;
        builtins["sqrt"] = &Interpreter::builtinSqrt;
        builtins["sin"] = &Interpreter::builtinSin;
        builtins["cos"] = &Interpreter::builtinCos;
        builtins["tan"] = &Interpreter::builtinTan;
        builtins["asin"] = &Interpreter::builtinAsin;
        builtins["acos"] = &Interpreter::builtinAcos;
        builtins["atan"] = &Interpreter::builtinAtan;
        builtins["type"] = &Interpreter::builtinType;
        builtins["filter"] = &Interpreter::builtinFilter;
        builtins["objectHasEx"] = &Interpreter::builtinObjectHasEx;
        builtins["length"] = &Interpreter::builtinLength;
        builtins["objectFieldsEx"] = &Interpreter::builtinObjectFieldsEx;
        builtins["codepoint"] = &Interpreter::builtinCodepoint;
        builtins["char"] = &Interpreter::builtinChar;
        builtins["log"] = &Interpreter::builtinLog;
        builtins["exp"] = &Interpreter::builtinExp;
        builtins["mantissa"] = &Interpreter::builtinMantissa;
        builtins["exponent"] = &Interpreter::builtinExponent;
        builtins["modulo"] = &Interpreter::builtinModulo;
        builtins["extVar"] = &Interpreter::builtinExtVar;
        builtins["primitiveEquals"] = &Interpreter::builtinPrimitiveEquals;
        builtins["native"] = &Interpreter::builtinNative;
        builtins["md5"] = &Interpreter::builtinMd5;
        builtins["trace"] = &Interpreter::builtinTrace;
        builtins["splitLimit"] = &Interpreter::builtinSplitLimit;
        builtins["substr"] = &Interpreter::builtinSubstr;
        builtins["range"] = &Interpreter::builtinRange;
        builtins["strReplace"] = &Interpreter::builtinStrReplace;
        builtins["asciiLower"] = &Interpreter::builtinAsciiLower;
        builtins["asciiUpper"] = &Interpreter::builtinAsciiUpper;
        builtins["join"] = &Interpreter::builtinJoin;
        builtins["parseJson"] = &Interpreter::builtinParseJson;
        builtins["parseYaml"] = &Interpreter::builtinParseYaml;
        builtins["encodeUTF8"] = &Interpreter::builtinEncodeUTF8;
        builtins["decodeUTF8"] = &Interpreter::builtinDecodeUTF8;
        builtins["atan2"] = &Interpreter::builtinAtan2;
        builtins["hypot"] = &Interpreter::builtinHypot;

        DesugaredObject *stdlib = makeStdlibAST(alloc, "__internal__");
        jsonnet_static_analysis(stdlib);
        stdlibAST = stdlib; // stdlibAST is const, so we need to do analysis before this assignment
        auto stdThunk = makeHeap<HeapThunk>(nullptr, nullptr, 0, static_cast<const AST*>(stdlibAST));
        stack.newCall(stdThunk->body->location, stdThunk, stdThunk->self, stdThunk->offset, stdThunk->upValues);
        evaluate(stdThunk->body, 0);
        stdObject = dynamic_cast<HeapObject*>(scratch.v.h);
        prepareSourceValThunks();
    }